

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt32::read
          (PLYValueBigUInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  byte *pbVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar4 = (byte *)plVar5[2];
  pbVar6 = (byte *)plVar5[3];
  if (pbVar4 < pbVar6) {
    uVar2 = (uint)*pbVar4;
    pbVar4 = pbVar4 + 1;
    plVar5[2] = (long)pbVar4;
  }
  else {
    uVar2 = (**(code **)(*plVar5 + 0x50))(plVar5);
    pbVar4 = (byte *)plVar5[2];
    pbVar6 = (byte *)plVar5[3];
  }
  uVar2 = uVar2 << 0x18;
  this->value = uVar2;
  if (pbVar4 < pbVar6) {
    bVar1 = *pbVar4;
    pbVar4 = pbVar4 + 1;
    plVar5[2] = (long)pbVar4;
  }
  else {
    bVar1 = (**(code **)(*plVar5 + 0x50))(plVar5);
    uVar2 = this->value;
    pbVar4 = (byte *)plVar5[2];
    pbVar6 = (byte *)plVar5[3];
  }
  uVar2 = (uint)bVar1 << 0x10 | uVar2;
  this->value = uVar2;
  if (pbVar4 < pbVar6) {
    uVar3 = (uint)*pbVar4;
    pbVar4 = pbVar4 + 1;
    plVar5[2] = (long)pbVar4;
  }
  else {
    uVar3 = (**(code **)(*plVar5 + 0x50))(plVar5);
    uVar2 = this->value;
    pbVar4 = (byte *)plVar5[2];
    pbVar6 = (byte *)plVar5[3];
  }
  uVar2 = (uVar3 & 0xff) << 8 | uVar2;
  this->value = uVar2;
  if (pbVar4 < pbVar6) {
    bVar1 = *pbVar4;
    plVar5[2] = (long)(pbVar4 + 1);
  }
  else {
    bVar1 = (**(code **)(*plVar5 + 0x50))(plVar5);
    uVar2 = this->value;
  }
  this->value = bVar1 | uVar2;
  return (ulong)(bVar1 | uVar2);
}

Assistant:

void read(std::streambuf *in)
    {
      value=(in->sbumpc()&0xff)<<24;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<8;
      value|=in->sbumpc()&0xff;
    }